

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopl.cpp
# Opt level: O1

void CALC_FCSLOT(OPL_CH *CH,OPL_SLOT *SLOT)

{
  byte bVar1;
  uint uVar2;
  uchar uVar3;
  uint uVar4;
  
  SLOT->Incr = (uint)SLOT->mul * CH->fc;
  bVar1 = CH->kcode >> (SLOT->KSR & 0x1f);
  uVar2 = (uint)bVar1;
  if (uVar2 != SLOT->ksr) {
    SLOT->ksr = bVar1;
    uVar4 = SLOT->ar + uVar2;
    if (uVar4 < 0x4e) {
      SLOT->eg_sh_ar = ""[uVar4];
      uVar3 = "pppppppppppppppp"[uVar4];
    }
    else {
      SLOT->eg_sh_ar = '\0';
      uVar3 = 'h';
    }
    SLOT->eg_sel_ar = uVar3;
    uVar4 = SLOT->dr + uVar2;
    SLOT->eg_sh_dr = ""[uVar4];
    SLOT->eg_sel_dr = "pppppppppppppppp"[uVar4];
    uVar2 = uVar2 + SLOT->rr;
    SLOT->eg_sh_rr = ""[uVar2];
    SLOT->eg_sel_rr = "pppppppppppppppp"[uVar2];
  }
  return;
}

Assistant:

void CALC_FCSLOT(OPL_CH *CH,OPL_SLOT *SLOT)
{
	int ksr;

	/* (frequency) phase increment counter */
	SLOT->Incr = CH->fc * SLOT->mul;
	ksr = CH->kcode >> SLOT->KSR;

	if( SLOT->ksr != ksr )
	{
		SLOT->ksr = ksr;

		/* calculate envelope generator rates */
		if ((SLOT->ar + SLOT->ksr) < 16+62)
		{
			SLOT->eg_sh_ar  = eg_rate_shift [SLOT->ar + SLOT->ksr ];
			SLOT->eg_sel_ar = eg_rate_select[SLOT->ar + SLOT->ksr ];
		}
		else
		{
			SLOT->eg_sh_ar  = 0;
			SLOT->eg_sel_ar = 13*RATE_STEPS;
		}
		SLOT->eg_sh_dr  = eg_rate_shift [SLOT->dr + SLOT->ksr ];
		SLOT->eg_sel_dr = eg_rate_select[SLOT->dr + SLOT->ksr ];
		SLOT->eg_sh_rr  = eg_rate_shift [SLOT->rr + SLOT->ksr ];
		SLOT->eg_sel_rr = eg_rate_select[SLOT->rr + SLOT->ksr ];
	}
}